

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::basic_dynamic_counter
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_RDI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *paVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *this_00;
  string *psVar2;
  string *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  MetricType in_stack_ffffffffffffff5c;
  _Alloc_hider in_stack_ffffffffffffff60;
  undefined1 local_60 [96];
  
  paVar1 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
            *)(local_60 + 0x20);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  this_00 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
             *)local_60;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  psVar2 = (string *)&stack0xffffffffffffff60;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array(this_00,paVar1);
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::metric_t<2ul>
            ((dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_> *)
             in_stack_ffffffffffffff60._M_p,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
             psVar2,this_00);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(in_RDI);
  std::__cxx11::string::~string(in_RDX);
  std::__cxx11::string::~string(in_RDX);
  in_RDI->_M_elems[0]._M_dataplus._M_p = (pointer)&PTR__basic_dynamic_counter_0032a1e8;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}